

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgFunctionGenerator.cpp
# Opt level: O0

void __thiscall rsg::FunctionGenerator::generate(FunctionGenerator *this)

{
  Variable *variable_00;
  GeneratorState *state;
  ConstValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  bool bVar1;
  int iVar2;
  BlockStatement *pBVar3;
  reference ppSVar4;
  undefined4 extraout_var;
  reference ppVVar5;
  VariableManager *pVVar6;
  VariableType *type;
  AssignStatement *this_00;
  ConstValueAccess CVar7;
  StridedValueRead<1> SVar8;
  ConstStridedValueAccess<1> CVar9;
  Scalar *in_stack_fffffffffffffd40;
  ValueRangeAccess local_1e0;
  VariableType *local_1c8;
  Scalar *pSStack_1c0;
  Scalar *local_1b8;
  ValueRangeAccess local_1b0;
  VariableType *local_198;
  Scalar *pSStack_190;
  Scalar *local_188;
  ConstStridedValueAccess<1> local_180;
  ConstValueRangeAccess local_170;
  ConstValueAccess local_158;
  StridedValueRead<1> local_148;
  ConstStridedValueAccess<1> local_138;
  ConstValueRangeAccess local_128;
  ConstValueAccess local_110;
  StridedValueRead<1> local_100;
  undefined1 local_f0 [8];
  ValueRange valueRange;
  ValueEntry *entry;
  Variable *variable;
  __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_58;
  iterator i;
  Statement *childStatement;
  Statement *curStatement;
  undefined1 local_28 [8];
  vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> statementStack;
  FunctionGenerator *this_local;
  
  statementStack.super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::vector
            ((vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *)local_28);
  GeneratorState::setStatementStack
            (this->m_state,(vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *)local_28);
  curStatement = &Function::getBody(this->m_function)->super_Statement;
  std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::push_back
            ((vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *)local_28,&curStatement);
  pBVar3 = Function::getBody(this->m_function);
  BlockStatement::init(pBVar3,(EVP_PKEY_CTX *)this->m_state);
  while (bVar1 = std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::empty
                           ((vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *)local_28)
        , ((bVar1 ^ 0xffU) & 1) != 0) {
    ppSVar4 = std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::back
                        ((vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *)local_28);
    iVar2 = (*(*ppSVar4)->_vptr_Statement[2])(*ppSVar4,this->m_state);
    i._M_current = (Variable **)CONCAT44(extraout_var,iVar2);
    if (i._M_current == (Variable **)0x0) {
      std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::pop_back
                ((vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *)local_28);
    }
    else {
      std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::push_back
                ((vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *)local_28,
                 (value_type *)&i);
    }
  }
  local_58._M_current =
       (Variable **)
       std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin
                 (&this->m_requiredAssignments);
  while( true ) {
    variable = (Variable *)
               std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end
                         (&this->m_requiredAssignments);
    bVar1 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                        *)&variable);
    if (!bVar1) break;
    ppVVar5 = __gnu_cxx::
              __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
              ::operator*(&local_58);
    variable_00 = *ppVVar5;
    pVVar6 = GeneratorState::getVariableManager(this->m_state);
    valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)VariableManager::getValue(pVVar6,variable_00);
    type = Variable::getType(variable_00);
    ValueRange::ValueRange((ValueRange *)local_f0,type);
    ValueEntry::getValueRange
              (&local_128,
               (ValueEntry *)
               valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
    CVar7 = ConstValueRangeAccess::getMin(&local_128);
    local_110 = CVar7;
    SVar8 = ConstStridedValueAccess<1>::value(&local_110);
    local_100 = SVar8;
    CVar9 = (ConstStridedValueAccess<1>)ValueRange::getMin((ValueRange *)local_f0);
    local_138 = CVar9;
    StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_138,&local_100);
    ValueEntry::getValueRange
              (&local_170,
               (ValueEntry *)
               valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
    CVar7 = ConstValueRangeAccess::getMax(&local_170);
    local_158 = CVar7;
    SVar8 = ConstStridedValueAccess<1>::value(&local_158);
    local_148 = SVar8;
    CVar9 = (ConstStridedValueAccess<1>)ValueRange::getMax((ValueRange *)local_f0);
    local_180 = CVar9;
    StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_180,&local_148);
    pVVar6 = GeneratorState::getVariableManager(this->m_state);
    VariableManager::removeValueFromCurrentScope(pVVar6,variable_00);
    ValueRange::asAccess(&local_1b0,(ValueRange *)local_f0);
    local_188 = local_1b0.super_ConstValueRangeAccess.m_max;
    local_198 = local_1b0.super_ConstValueRangeAccess.m_type;
    pSStack_190 = local_1b0.super_ConstValueRangeAccess.m_min;
    valueRange_01.m_min = local_1b0.super_ConstValueRangeAccess.m_max;
    valueRange_01.m_type = (VariableType *)local_1b0.super_ConstValueRangeAccess.m_min;
    valueRange_01.m_max = in_stack_fffffffffffffd40;
    bVar1 = isUndefinedValueRange(valueRange_01);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      pBVar3 = Function::getBody(this->m_function);
      this_00 = (AssignStatement *)operator_new(0x18);
      state = this->m_state;
      ValueRange::asAccess(&local_1e0,(ValueRange *)local_f0);
      local_1b8 = local_1e0.super_ConstValueRangeAccess.m_max;
      local_1c8 = local_1e0.super_ConstValueRangeAccess.m_type;
      pSStack_1c0 = local_1e0.super_ConstValueRangeAccess.m_min;
      valueRange_00.m_min = local_1e0.super_ConstValueRangeAccess.m_min;
      valueRange_00.m_type = local_1e0.super_ConstValueRangeAccess.m_type;
      valueRange_00.m_max = local_1e0.super_ConstValueRangeAccess.m_max;
      AssignStatement::AssignStatement(this_00,state,variable_00,valueRange_00);
      BlockStatement::addChild(pBVar3,(Statement *)this_00);
    }
    ValueRange::~ValueRange((ValueRange *)local_f0);
    __gnu_cxx::
    __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
    ::operator++(&local_58,0);
  }
  std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::~vector
            ((vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *)local_28);
  return;
}

Assistant:

void FunctionGenerator::generate (void)
{
	std::vector<Statement*>	statementStack;

	// Initialize
	m_state.setStatementStack(statementStack);
	statementStack.push_back(&m_function.getBody());
	m_function.getBody().init(m_state);

	// Process until statement stack is empty
	while (!statementStack.empty())
	{
		DE_ASSERT((int)statementStack.size() <= m_state.getShaderParameters().maxStatementDepth);

		Statement*	curStatement	= statementStack.back();
		Statement*	childStatement	= curStatement->createNextChild(m_state);

		if (childStatement)
			statementStack.push_back(childStatement);
		else
			statementStack.pop_back();
	}

	// Create assignments if variables have bound value range
	for (vector<Variable*>::iterator i = m_requiredAssignments.begin(); i != m_requiredAssignments.end(); i++)
	{
		Variable*				variable		= *i;
		const ValueEntry*		entry			= m_state.getVariableManager().getValue(variable);
		ValueRange				valueRange(variable->getType());

		valueRange.getMin() = entry->getValueRange().getMin().value();
		valueRange.getMax() = entry->getValueRange().getMax().value();

		// Remove value entry from this scope. After this entry ptr is invalid.
		m_state.getVariableManager().removeValueFromCurrentScope(variable);

		if (!isUndefinedValueRange(valueRange.asAccess()))
			m_function.getBody().addChild(new AssignStatement(m_state, variable, valueRange.asAccess()));
	}
}